

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_substring_op(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp start,sexp end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  sexp psVar6;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp unaff_retaddr;
  sexp res;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    if (((ulong)in_R8 & 7) == 2) {
      if (in_R9 == (sexp)&DAT_0000003e) {
        in_R9 = (sexp)((in_RCX->value).string.length << 3 | 2);
      }
      if (((ulong)in_R9 & 7) == 2) {
        auVar1._8_8_ = (long)in_R8 >> 0x3f;
        auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffd;
        if ((((SUB168(auVar1 / SEXT816(8),0) < 0) ||
             (auVar2._8_8_ = (long)in_R8 >> 0x3f, auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffd,
             (in_RCX->value).uvector.length < SUB168(auVar2 / SEXT816(8),0))) ||
            (auVar3._8_8_ = (long)in_R9 >> 0x3f, auVar3._0_8_ = (ulong)in_R9 & 0xfffffffffffffffd,
            SUB168(auVar3 / SEXT816(8),0) < 0)) ||
           ((auVar4._8_8_ = (long)in_R9 >> 0x3f, auVar4._0_8_ = (ulong)in_R9 & 0xfffffffffffffffd,
            (in_RCX->value).uvector.length < SUB168(auVar4 / SEXT816(8),0) || (in_R9 < in_R8)))) {
          psVar6 = sexp_range_exception(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
        }
        else {
          psVar6 = sexp_make_string_op((sexp)n,str,(sexp_sint_t)start,end,res);
          auVar5._8_8_ = (long)in_R8 >> 0x3f;
          auVar5._0_8_ = (ulong)in_R8 & 0xfffffffffffffffd;
          memcpy((((psVar6->value).type.name)->value).flonum_bits + 8 +
                 (long)(psVar6->value).type.cpl,
                 (((in_RCX->value).type.name)->value).flonum_bits + 8 +
                 (long)(in_RCX->value).type.cpl + SUB168(auVar5 / SEXT816(8),0),
                 (psVar6->value).string.length);
          ((((psVar6->value).type.name)->value).flonum_bits + 8 + (long)(psVar6->value).type.cpl)
          [(long)(psVar6->value).type.slots] = '\0';
        }
      }
      else {
        psVar6 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
      }
    }
    else {
      psVar6 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
    }
  }
  else {
    psVar6 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
  }
  return psVar6;
}

Assistant:

sexp sexp_substring_op (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp start, sexp end) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, start);
  if (sexp_not(end))
    end = sexp_make_string_cursor(sexp_string_size(str));
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, end);
  if ((sexp_unbox_string_cursor(start) < 0)
      || (sexp_unbox_string_cursor(start) > (sexp_sint_t)sexp_string_size(str))
      || (sexp_unbox_string_cursor(end) < 0)
      || (sexp_unbox_string_cursor(end) > (sexp_sint_t)sexp_string_size(str))
      || (end < start))
    return sexp_range_exception(ctx, str, start, end);
  res = sexp_make_string(ctx, sexp_make_fixnum(sexp_unbox_string_cursor(end) - sexp_unbox_string_cursor(start)), SEXP_VOID);
  memcpy(sexp_string_data(res),
         sexp_string_data(str)+sexp_unbox_string_cursor(start),
         sexp_string_size(res));
  sexp_string_data(res)[sexp_string_size(res)] = '\0';
  sexp_update_string_index_lookup(ctx, res);
  return res;
}